

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::ObjectIntersectorK<8,_false>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  byte bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  ulong uVar40;
  ulong uVar41;
  _func_int **pp_Var42;
  size_t i_1;
  ulong uVar43;
  long lVar44;
  undefined4 uVar45;
  ulong uVar46;
  ulong *puVar47;
  undefined1 (*pauVar48) [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar71 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_27e0 [32];
  RTCIntersectFunctionNArguments local_2798;
  Geometry *local_2768;
  undefined8 local_2760;
  RTCIntersectArguments *local_2758;
  undefined1 local_2750 [16];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  float fStack_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  ulong auStack_2620 [244];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar65 [64];
  undefined1 auVar70 [64];
  undefined1 auVar69 [64];
  
  auStack_2620[3] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (auStack_2620[3] != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar62 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar26 = vpcmpeqd_avx(auVar62,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar27 = vpcmpeqd_avx(auVar62,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar27 = vpackssdw_avx(auVar26,auVar27);
      auVar26 = vpacksswb_avx(auVar27,auVar27);
      bVar31 = SUB161(auVar26 >> 7,0) & 1 | (SUB161(auVar26 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar26 >> 0x17,0) & 1) << 2 | (SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar26 >> 0x27,0) & 1) << 4 | (SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar26 >> 0x37,0) & 1) << 6 | SUB161(auVar26 >> 0x3f,0) << 7;
      if (bVar31 != 0) {
        uVar43 = (ulong)bVar31;
        auVar83 = *(undefined1 (*) [32])(ray + 0x80);
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        auVar53._16_4_ = 0x7fffffff;
        auVar53._20_4_ = 0x7fffffff;
        auVar53._24_4_ = 0x7fffffff;
        auVar53._28_4_ = 0x7fffffff;
        auVar67._8_4_ = 0x219392ef;
        auVar67._0_8_ = 0x219392ef219392ef;
        auVar67._12_4_ = 0x219392ef;
        auVar67._16_4_ = 0x219392ef;
        auVar67._20_4_ = 0x219392ef;
        auVar67._24_4_ = 0x219392ef;
        auVar67._28_4_ = 0x219392ef;
        auVar54 = vandps_avx(auVar83,auVar53);
        auVar54 = vcmpps_avx(auVar54,auVar67,1);
        auVar63 = vblendvps_avx(auVar83,auVar67,auVar54);
        local_2660 = *(undefined8 *)ray;
        uStack_2658 = *(undefined8 *)(ray + 8);
        uStack_2650 = *(undefined8 *)(ray + 0x10);
        uStack_2648 = *(undefined8 *)(ray + 0x18);
        auVar54 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar55 = vandps_avx(auVar54,auVar53);
        auVar55 = vcmpps_avx(auVar55,auVar67,1);
        auVar78 = vblendvps_avx(auVar54,auVar67,auVar55);
        auVar55 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar53 = vandps_avx(auVar55,auVar53);
        auVar53 = vcmpps_avx(auVar53,auVar67,1);
        auVar68 = vrcpps_avx(auVar63);
        auVar53 = vblendvps_avx(auVar55,auVar67,auVar53);
        auVar81._8_4_ = 0x3f800000;
        auVar81._0_8_ = 0x3f8000003f800000;
        auVar81._12_4_ = 0x3f800000;
        auVar81._16_4_ = 0x3f800000;
        auVar81._20_4_ = 0x3f800000;
        auVar81._24_4_ = 0x3f800000;
        auVar81._28_4_ = 0x3f800000;
        local_2680 = *(undefined8 *)(ray + 0x20);
        uStack_2678 = *(undefined8 *)(ray + 0x28);
        uStack_2670 = *(undefined8 *)(ray + 0x30);
        uStack_2668 = *(undefined8 *)(ray + 0x38);
        auVar67 = vrcpps_avx(auVar78);
        fVar5 = auVar68._0_4_;
        fVar8 = auVar68._4_4_;
        auVar29._4_4_ = auVar63._4_4_ * fVar8;
        auVar29._0_4_ = auVar63._0_4_ * fVar5;
        fVar11 = auVar68._8_4_;
        auVar29._8_4_ = auVar63._8_4_ * fVar11;
        fVar14 = auVar68._12_4_;
        auVar29._12_4_ = auVar63._12_4_ * fVar14;
        fVar17 = auVar68._16_4_;
        auVar29._16_4_ = auVar63._16_4_ * fVar17;
        fVar20 = auVar68._20_4_;
        auVar29._20_4_ = auVar63._20_4_ * fVar20;
        fVar23 = auVar68._24_4_;
        auVar29._24_4_ = auVar63._24_4_ * fVar23;
        auVar29._28_4_ = auVar63._28_4_;
        auVar29 = vsubps_avx(auVar81,auVar29);
        fVar6 = auVar67._0_4_;
        fVar9 = auVar67._4_4_;
        auVar30._4_4_ = auVar78._4_4_ * fVar9;
        auVar30._0_4_ = auVar78._0_4_ * fVar6;
        fVar12 = auVar67._8_4_;
        auVar30._8_4_ = auVar78._8_4_ * fVar12;
        fVar15 = auVar67._12_4_;
        auVar30._12_4_ = auVar78._12_4_ * fVar15;
        fVar18 = auVar67._16_4_;
        auVar30._16_4_ = auVar78._16_4_ * fVar18;
        fVar21 = auVar67._20_4_;
        auVar30._20_4_ = auVar78._20_4_ * fVar21;
        fVar24 = auVar67._24_4_;
        auVar30._24_4_ = auVar78._24_4_ * fVar24;
        auVar30._28_4_ = auVar63._28_4_;
        auVar30 = vsubps_avx(auVar81,auVar30);
        auVar63 = vrcpps_avx(auVar53);
        fVar7 = auVar63._0_4_;
        fVar10 = auVar63._4_4_;
        auVar32._4_4_ = auVar53._4_4_ * fVar10;
        auVar32._0_4_ = auVar53._0_4_ * fVar7;
        fVar13 = auVar63._8_4_;
        auVar32._8_4_ = auVar53._8_4_ * fVar13;
        fVar16 = auVar63._12_4_;
        auVar32._12_4_ = auVar53._12_4_ * fVar16;
        fVar19 = auVar63._16_4_;
        auVar32._16_4_ = auVar53._16_4_ * fVar19;
        fVar22 = auVar63._20_4_;
        auVar32._20_4_ = auVar53._20_4_ * fVar22;
        fVar25 = auVar63._24_4_;
        auVar32._24_4_ = auVar53._24_4_ * fVar25;
        auVar32._28_4_ = auVar78._28_4_;
        auVar53 = vsubps_avx(auVar81,auVar32);
        auVar79._8_4_ = 1;
        auVar79._0_8_ = 0x100000001;
        auVar79._12_4_ = 1;
        auVar79._16_4_ = 1;
        auVar79._20_4_ = 1;
        auVar79._24_4_ = 1;
        auVar79._28_4_ = 1;
        auVar78 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar83 = vcmpps_avx(auVar83,auVar78,1);
        auVar83 = vandps_avx(auVar79,auVar83);
        auVar80._8_4_ = 2;
        auVar80._0_8_ = 0x200000002;
        auVar80._12_4_ = 2;
        auVar80._16_4_ = 2;
        auVar80._20_4_ = 2;
        auVar80._24_4_ = 2;
        auVar80._28_4_ = 2;
        auVar54 = vcmpps_avx(auVar54,auVar78,1);
        auVar54 = vandps_avx(auVar80,auVar54);
        local_26a0 = *(undefined4 *)(ray + 0x40);
        uStack_269c = *(undefined4 *)(ray + 0x44);
        uStack_2698 = *(undefined4 *)(ray + 0x48);
        uStack_2694 = *(undefined4 *)(ray + 0x4c);
        uStack_2690 = *(undefined4 *)(ray + 0x50);
        uStack_268c = *(undefined4 *)(ray + 0x54);
        uStack_2688 = *(undefined4 *)(ray + 0x58);
        fStack_2684 = *(float *)(ray + 0x5c);
        auVar54 = vorps_avx(auVar54,auVar83);
        auVar83 = vcmpps_avx(auVar55,ZEXT1232(ZEXT412(0)) << 0x20,1);
        auVar78._8_4_ = 4;
        auVar78._0_8_ = 0x400000004;
        auVar78._12_4_ = 4;
        auVar78._16_4_ = 4;
        auVar78._20_4_ = 4;
        auVar78._24_4_ = 4;
        auVar78._28_4_ = 4;
        auVar83 = vandps_avx(auVar83,auVar78);
        auVar54 = vorps_avx(auVar54,auVar83);
        auVar28 = vpmovsxwd_avx(auVar27);
        auVar27 = vpunpckhwd_avx(auVar27,auVar27);
        auVar55._16_16_ = auVar27;
        auVar55._0_16_ = auVar28;
        auVar83 = vcmpps_avx(auVar78,auVar78,0xf);
        local_2740 = vblendvps_avx(auVar83,auVar54,auVar55);
        auVar26 = vblendvps_avx(auVar62,auVar54._16_16_,auVar27);
        do {
          lVar44 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
            }
          }
          uVar45 = *(undefined4 *)(local_2740 + lVar44 * 4);
          auVar82._4_4_ = uVar45;
          auVar82._0_4_ = uVar45;
          auVar82._8_4_ = uVar45;
          auVar82._12_4_ = uVar45;
          auVar62 = vpcmpeqd_avx(auVar82,auVar26);
          auVar82 = vpcmpeqd_avx(auVar82,local_2740._0_16_);
          auVar83._16_16_ = auVar62;
          auVar83._0_16_ = SUB3216(*(undefined1 (*) [32])(ray + 0x100),0);
          auVar83 = vblendps_avx(ZEXT1632(auVar82),auVar83,0xf0);
          uVar45 = vmovmskps_avx(auVar83);
          uVar43 = uVar43 & ~CONCAT44((int)((ulong)lVar44 >> 0x20),uVar45);
        } while (uVar43 != 0);
        local_26c0 = auVar29._0_4_ * fVar5 + fVar5;
        fStack_26bc = auVar29._4_4_ * fVar8 + fVar8;
        fStack_26b8 = auVar29._8_4_ * fVar11 + fVar11;
        fStack_26b4 = auVar29._12_4_ * fVar14 + fVar14;
        fStack_26b0 = auVar29._16_4_ * fVar17 + fVar17;
        fStack_26ac = auVar29._20_4_ * fVar20 + fVar20;
        fStack_26a8 = auVar29._24_4_ * fVar23 + fVar23;
        fStack_26a4 = auVar68._28_4_ + 0.0;
        local_26e0 = auVar30._0_4_ * fVar6 + fVar6;
        fStack_26dc = auVar30._4_4_ * fVar9 + fVar9;
        fStack_26d8 = auVar30._8_4_ * fVar12 + fVar12;
        fStack_26d4 = auVar30._12_4_ * fVar15 + fVar15;
        fStack_26d0 = auVar30._16_4_ * fVar18 + fVar18;
        fStack_26cc = auVar30._20_4_ * fVar21 + fVar21;
        fStack_26c8 = auVar30._24_4_ * fVar24 + fVar24;
        fStack_26c4 = *(float *)(ray + 0x5c) + auVar67._28_4_;
        local_2700 = auVar53._0_4_ * fVar7 + fVar7;
        fStack_26fc = auVar53._4_4_ * fVar10 + fVar10;
        fStack_26f8 = auVar53._8_4_ * fVar13 + fVar13;
        fStack_26f4 = auVar53._12_4_ * fVar16 + fVar16;
        fStack_26f0 = auVar53._16_4_ * fVar19 + fVar19;
        fStack_26ec = auVar53._20_4_ * fVar22 + fVar22;
        fStack_26e8 = auVar53._24_4_ * fVar25 + fVar25;
        fStack_26e4 = auVar53._28_4_ + auVar63._28_4_;
        auVar54 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar83 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar54);
        auVar54 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar54);
        puVar47 = auStack_2620 + 4;
        pauVar48 = (undefined1 (*) [32])local_1e40;
        auVar55 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_2740 = vcmpps_avx(auVar55,auVar55,0xf);
        auVar63._16_16_ = auVar27;
        auVar63._0_16_ = auVar28;
        auVar65 = ZEXT3264(auVar63);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        local_1e60 = vblendvps_avx(local_1e80,auVar83,auVar63);
        auVar68._8_4_ = 0xff800000;
        auVar68._0_8_ = 0xff800000ff800000;
        auVar68._12_4_ = 0xff800000;
        auVar68._16_4_ = 0xff800000;
        auVar68._20_4_ = 0xff800000;
        auVar68._24_4_ = 0xff800000;
        auVar68._28_4_ = 0xff800000;
        auVar69 = ZEXT3264(auVar68);
        local_27e0 = vblendvps_avx(auVar68,auVar54,auVar63);
        auStack_2620[2] = 0xfffffffffffffff8;
        local_2720 = local_1e60;
        local_2750 = local_1e60._16_16_;
LAB_00f4a900:
        puVar2 = puVar47 + -1;
        if (*puVar2 != 0xfffffffffffffff8) {
          puVar47 = puVar47 + -1;
          pauVar1 = pauVar48 + -1;
          auVar75 = ZEXT3264(*pauVar1);
          pauVar48 = pauVar48 + -1;
          auVar83 = vcmpps_avx(*pauVar1,local_27e0,1);
          uVar43 = *puVar2;
          if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar83 >> 0x7f,0) != '\0') ||
                (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar83 >> 0xbf,0) != '\0') ||
              (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar83[0x1f] < '\0') {
            while ((uVar43 & 8) == 0) {
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar54._16_4_ = 0x7f800000;
              auVar54._20_4_ = 0x7f800000;
              auVar54._24_4_ = 0x7f800000;
              auVar54._28_4_ = 0x7f800000;
              uVar46 = 0;
              uVar40 = 8;
              for (lVar44 = 0;
                  (auVar75 = ZEXT3264(auVar54), lVar44 != 4 &&
                  (uVar4 = *(ulong *)((uVar43 & 0xfffffffffffffff0) + lVar44 * 8), uVar4 != 8));
                  lVar44 = lVar44 + 1) {
                uVar45 = *(undefined4 *)(uVar43 + 0x20 + lVar44 * 4);
                auVar56._4_4_ = uVar45;
                auVar56._0_4_ = uVar45;
                auVar56._8_4_ = uVar45;
                auVar56._12_4_ = uVar45;
                auVar56._16_4_ = uVar45;
                auVar56._20_4_ = uVar45;
                auVar56._24_4_ = uVar45;
                auVar56._28_4_ = uVar45;
                auVar39._8_8_ = uStack_2658;
                auVar39._0_8_ = local_2660;
                auVar39._16_8_ = uStack_2650;
                auVar39._24_8_ = uStack_2648;
                auVar83 = vsubps_avx(auVar56,auVar39);
                auVar61._0_4_ = local_26c0 * auVar83._0_4_;
                auVar61._4_4_ = fStack_26bc * auVar83._4_4_;
                auVar61._8_4_ = fStack_26b8 * auVar83._8_4_;
                auVar61._12_4_ = fStack_26b4 * auVar83._12_4_;
                auVar75._16_4_ = fStack_26b0 * auVar83._16_4_;
                auVar75._0_16_ = auVar61;
                auVar75._20_4_ = fStack_26ac * auVar83._20_4_;
                auVar75._28_36_ = auVar65._28_36_;
                auVar75._24_4_ = fStack_26a8 * auVar83._24_4_;
                uVar45 = *(undefined4 *)(uVar43 + 0x40 + lVar44 * 4);
                auVar57._4_4_ = uVar45;
                auVar57._0_4_ = uVar45;
                auVar57._8_4_ = uVar45;
                auVar57._12_4_ = uVar45;
                auVar57._16_4_ = uVar45;
                auVar57._20_4_ = uVar45;
                auVar57._24_4_ = uVar45;
                auVar57._28_4_ = uVar45;
                auVar38._8_8_ = uStack_2678;
                auVar38._0_8_ = local_2680;
                auVar38._16_8_ = uStack_2670;
                auVar38._24_8_ = uStack_2668;
                auVar83 = vsubps_avx(auVar57,auVar38);
                auVar66._0_4_ = local_26e0 * auVar83._0_4_;
                auVar66._4_4_ = fStack_26dc * auVar83._4_4_;
                auVar66._8_4_ = fStack_26d8 * auVar83._8_4_;
                auVar66._12_4_ = fStack_26d4 * auVar83._12_4_;
                auVar70._16_4_ = fStack_26d0 * auVar83._16_4_;
                auVar70._0_16_ = auVar66;
                auVar70._20_4_ = fStack_26cc * auVar83._20_4_;
                auVar70._28_36_ = auVar69._28_36_;
                auVar70._24_4_ = fStack_26c8 * auVar83._24_4_;
                uVar45 = *(undefined4 *)(uVar43 + 0x60 + lVar44 * 4);
                auVar58._4_4_ = uVar45;
                auVar58._0_4_ = uVar45;
                auVar58._8_4_ = uVar45;
                auVar58._12_4_ = uVar45;
                auVar58._16_4_ = uVar45;
                auVar58._20_4_ = uVar45;
                auVar58._24_4_ = uVar45;
                auVar58._28_4_ = uVar45;
                auVar37._4_4_ = uStack_269c;
                auVar37._0_4_ = local_26a0;
                auVar37._8_4_ = uStack_2698;
                auVar37._12_4_ = uStack_2694;
                auVar37._16_4_ = uStack_2690;
                auVar37._20_4_ = uStack_268c;
                auVar37._24_4_ = uStack_2688;
                auVar37._28_4_ = fStack_2684;
                auVar83 = vsubps_avx(auVar58,auVar37);
                auVar52._0_4_ = local_2700 * auVar83._0_4_;
                auVar52._4_4_ = fStack_26fc * auVar83._4_4_;
                auVar52._8_4_ = fStack_26f8 * auVar83._8_4_;
                auVar52._12_4_ = fStack_26f4 * auVar83._12_4_;
                auVar33._16_4_ = fStack_26f0 * auVar83._16_4_;
                auVar33._0_16_ = auVar52;
                auVar33._20_4_ = fStack_26ec * auVar83._20_4_;
                auVar33._24_4_ = fStack_26e8 * auVar83._24_4_;
                auVar33._28_4_ = auVar83._28_4_;
                uVar45 = *(undefined4 *)(uVar43 + 0x30 + lVar44 * 4);
                auVar72._4_4_ = uVar45;
                auVar72._0_4_ = uVar45;
                auVar72._8_4_ = uVar45;
                auVar72._12_4_ = uVar45;
                auVar72._16_4_ = uVar45;
                auVar72._20_4_ = uVar45;
                auVar72._24_4_ = uVar45;
                auVar72._28_4_ = uVar45;
                auVar83 = vsubps_avx(auVar72,auVar39);
                auVar76._0_4_ = local_26c0 * auVar83._0_4_;
                auVar76._4_4_ = fStack_26bc * auVar83._4_4_;
                auVar76._8_4_ = fStack_26b8 * auVar83._8_4_;
                auVar76._12_4_ = fStack_26b4 * auVar83._12_4_;
                auVar34._16_4_ = fStack_26b0 * auVar83._16_4_;
                auVar34._0_16_ = auVar76;
                auVar34._20_4_ = fStack_26ac * auVar83._20_4_;
                auVar34._24_4_ = fStack_26a8 * auVar83._24_4_;
                auVar34._28_4_ = fStack_26a4;
                uVar45 = *(undefined4 *)(uVar43 + 0x50 + lVar44 * 4);
                auVar73._4_4_ = uVar45;
                auVar73._0_4_ = uVar45;
                auVar73._8_4_ = uVar45;
                auVar73._12_4_ = uVar45;
                auVar73._16_4_ = uVar45;
                auVar73._20_4_ = uVar45;
                auVar73._24_4_ = uVar45;
                auVar73._28_4_ = uVar45;
                auVar83 = vsubps_avx(auVar73,auVar38);
                auVar77._0_4_ = local_26e0 * auVar83._0_4_;
                auVar77._4_4_ = fStack_26dc * auVar83._4_4_;
                auVar77._8_4_ = fStack_26d8 * auVar83._8_4_;
                auVar77._12_4_ = fStack_26d4 * auVar83._12_4_;
                auVar35._16_4_ = fStack_26d0 * auVar83._16_4_;
                auVar35._0_16_ = auVar77;
                auVar35._20_4_ = fStack_26cc * auVar83._20_4_;
                auVar35._24_4_ = fStack_26c8 * auVar83._24_4_;
                auVar35._28_4_ = (int)((ulong)uStack_2668 >> 0x20);
                uVar45 = *(undefined4 *)(uVar43 + 0x70 + lVar44 * 4);
                auVar74._4_4_ = uVar45;
                auVar74._0_4_ = uVar45;
                auVar74._8_4_ = uVar45;
                auVar74._12_4_ = uVar45;
                auVar74._16_4_ = uVar45;
                auVar74._20_4_ = uVar45;
                auVar74._24_4_ = uVar45;
                auVar74._28_4_ = uVar45;
                auVar83 = vsubps_avx(auVar74,auVar37);
                auVar71._0_4_ = local_2700 * auVar83._0_4_;
                auVar71._4_4_ = fStack_26fc * auVar83._4_4_;
                auVar71._8_4_ = fStack_26f8 * auVar83._8_4_;
                auVar71._12_4_ = fStack_26f4 * auVar83._12_4_;
                auVar36._16_4_ = fStack_26f0 * auVar83._16_4_;
                auVar36._0_16_ = auVar71;
                auVar36._20_4_ = fStack_26ec * auVar83._20_4_;
                auVar36._24_4_ = fStack_26e8 * auVar83._24_4_;
                auVar36._28_4_ = auVar83._28_4_;
                auVar26 = vpminsd_avx(auVar75._16_16_,auVar34._16_16_);
                auVar27 = vpminsd_avx(auVar61,auVar76);
                auVar62 = vpminsd_avx(auVar70._16_16_,auVar35._16_16_);
                auVar26 = vpmaxsd_avx(auVar26,auVar62);
                auVar62 = vpminsd_avx(auVar66,auVar77);
                auVar27 = vpmaxsd_avx(auVar27,auVar62);
                auVar62 = vpminsd_avx(auVar52,auVar71);
                auVar27 = vpmaxsd_avx(auVar27,auVar62);
                auVar62 = vpminsd_avx(auVar33._16_16_,auVar36._16_16_);
                auVar26 = vpmaxsd_avx(auVar26,auVar62);
                auVar62 = vpmaxsd_avx(auVar27,local_2720._0_16_);
                auVar28 = vpmaxsd_avx(auVar26,local_2750);
                auVar49._16_16_ = auVar28;
                auVar49._0_16_ = auVar28;
                auVar83 = vblendps_avx(ZEXT1632(auVar62),auVar49,0xf0);
                auVar62 = vpmaxsd_avx(auVar61,auVar76);
                auVar28 = vpmaxsd_avx(auVar75._16_16_,auVar34._16_16_);
                auVar82 = vpmaxsd_avx(auVar66,auVar77);
                auVar82 = vpminsd_avx(auVar62,auVar82);
                auVar65 = ZEXT1664(auVar82);
                auVar62 = vpmaxsd_avx(auVar70._16_16_,auVar35._16_16_);
                auVar61 = vpminsd_avx(auVar28,auVar62);
                auVar62 = vpmaxsd_avx(auVar33._16_16_,auVar36._16_16_);
                auVar28 = vpmaxsd_avx(auVar52,auVar71);
                auVar62 = vpminsd_avx(auVar62,local_27e0._16_16_);
                auVar62 = vpminsd_avx(auVar61,auVar62);
                auVar69 = ZEXT1664(auVar62);
                auVar28 = vpminsd_avx(auVar28,local_27e0._0_16_);
                auVar28 = vpminsd_avx(auVar82,auVar28);
                auVar59._16_16_ = auVar62;
                auVar59._0_16_ = auVar28;
                auVar55 = vcmpps_avx(auVar83,auVar59,2);
                uVar41 = uVar40;
                auVar83 = auVar54;
                if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar55 >> 0x7f,0) != '\0') ||
                      (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0xbf,0) != '\0') ||
                    (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar55[0x1f] < '\0') {
                  auVar50._16_16_ = auVar26;
                  auVar50._0_16_ = auVar27;
                  auVar83 = vblendps_avx(auVar50,auVar50,0xf0);
                  auVar64._8_4_ = 0x7f800000;
                  auVar64._0_8_ = 0x7f8000007f800000;
                  auVar64._12_4_ = 0x7f800000;
                  auVar64._16_4_ = 0x7f800000;
                  auVar64._20_4_ = 0x7f800000;
                  auVar64._24_4_ = 0x7f800000;
                  auVar64._28_4_ = 0x7f800000;
                  auVar83 = vblendvps_avx(auVar64,auVar83,auVar55);
                  auVar69 = ZEXT3264(auVar54);
                  auVar55 = vcmpps_avx(auVar83,auVar54,1);
                  if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar55 >> 0x7f,0) == '\0') &&
                        (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar55 >> 0xbf,0) == '\0') &&
                      (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar55[0x1f]) {
                    auVar65 = ZEXT3264(auVar83);
                    uVar40 = uVar4;
                    auVar83 = auVar54;
                  }
                  else {
                    auVar65 = ZEXT3264(auVar54);
                    uVar41 = uVar4;
                    if (uVar40 == 8) goto LAB_00f4ab31;
                  }
                  uVar46 = uVar46 + 1;
                  *puVar47 = uVar40;
                  puVar47 = puVar47 + 1;
                  *pauVar48 = auVar65._0_32_;
                  pauVar48 = pauVar48 + 1;
                }
LAB_00f4ab31:
                uVar40 = uVar41;
                auVar54 = auVar83;
              }
              if (uVar40 == 8) goto LAB_00f4a900;
              uVar43 = uVar40;
              if (1 < uVar46) {
                auVar83 = pauVar48[-2];
                auVar54 = pauVar48[-1];
                auVar69 = ZEXT3264(auVar54);
                auVar53 = vcmpps_avx(auVar83,auVar54,1);
                auVar55 = auVar54;
                if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar53 >> 0x7f,0) != '\0') ||
                      (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar53 >> 0xbf,0) != '\0') ||
                    (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar53[0x1f] < '\0') {
                  pauVar48[-2] = auVar54;
                  pauVar48[-1] = auVar83;
                  auVar26 = vpermilps_avx(*(undefined1 (*) [16])(puVar47 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar47 + -2) = auVar26;
                  auVar55 = auVar83;
                  auVar83 = auVar54;
                }
                auVar65 = ZEXT3264(auVar83);
                if (uVar46 != 2) {
                  auVar54 = pauVar48[-3];
                  auVar69 = ZEXT3264(auVar54);
                  auVar53 = vcmpps_avx(auVar54,auVar55,1);
                  if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar53 >> 0x7f,0) != '\0') ||
                        (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar53 >> 0xbf,0) != '\0') ||
                      (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar53[0x1f] < '\0') {
                    pauVar48[-3] = auVar55;
                    pauVar48[-1] = auVar54;
                    uVar40 = puVar47[-3];
                    puVar47[-3] = puVar47[-1];
                    puVar47[-1] = uVar40;
                    auVar54 = auVar55;
                  }
                  auVar55 = vcmpps_avx(auVar54,auVar83,1);
                  if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar55 >> 0x7f,0) != '\0') ||
                        (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar55 >> 0xbf,0) != '\0') ||
                      (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar55[0x1f] < '\0') {
                    pauVar48[-3] = auVar83;
                    pauVar48[-2] = auVar54;
                    auVar26 = vpermilps_avx(*(undefined1 (*) [16])(puVar47 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar47 + -3) = auVar26;
                  }
                }
              }
            }
            if (uVar43 == 0xfffffffffffffff8) {
              return;
            }
            auVar83 = vcmpps_avx(local_27e0,auVar75._0_32_,6);
            auVar69 = ZEXT3264(auVar83);
            if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar83 >> 0x7f,0) != '\0') ||
                  (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar83 >> 0xbf,0) != '\0') ||
                (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar83[0x1f] < '\0') {
              for (lVar44 = 0; auVar69 = ZEXT3264(auVar83),
                  (ulong)((uint)uVar43 & 0xf) - 8 != lVar44; lVar44 = lVar44 + 1) {
                local_2798.geomID = *(uint *)((uVar43 & 0xfffffffffffffff0) + lVar44 * 8);
                local_2768 = (context->scene->geometries).items[local_2798.geomID].ptr;
                uVar3 = local_2768->mask;
                auVar51._4_4_ = uVar3;
                auVar51._0_4_ = uVar3;
                auVar51._8_4_ = uVar3;
                auVar51._12_4_ = uVar3;
                auVar51._16_4_ = uVar3;
                auVar51._20_4_ = uVar3;
                auVar51._24_4_ = uVar3;
                auVar51._28_4_ = uVar3;
                auVar54 = vandps_avx(auVar51,*(undefined1 (*) [32])(ray + 0x120));
                auVar62 = ZEXT816(0) << 0x40;
                auVar65 = ZEXT1664(auVar62);
                auVar26 = vpcmpeqd_avx(auVar54._16_16_,auVar62);
                auVar27 = vpcmpeqd_avx(auVar54._0_16_,auVar62);
                auVar60._16_16_ = auVar26;
                auVar60._0_16_ = auVar27;
                auVar54 = vblendps_avx(ZEXT1632(auVar27),auVar60,0xf0);
                auVar55 = auVar83 & ~auVar54;
                if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar55 >> 0x7f,0) != '\0') ||
                      (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0xbf,0) != '\0') ||
                    (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar55[0x1f] < '\0') {
                  local_2640 = vandnps_avx(auVar54,auVar83);
                  local_2798.primID = *(uint *)((uVar43 & 0xfffffffffffffff0) + 4 + lVar44 * 8);
                  local_2798.valid = (int *)local_2640;
                  local_2798.geometryUserPtr = local_2768->userPtr;
                  local_2798.context = context->user;
                  local_2798.N = 8;
                  local_2760 = 0;
                  local_2758 = context->args;
                  pp_Var42 = (_func_int **)local_2758->intersect;
                  if (pp_Var42 == (_func_int **)0x0) {
                    pp_Var42 = local_2768[1].super_RefCount._vptr_RefCount;
                  }
                  auVar65 = ZEXT1664(auVar62);
                  local_2798.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var42)(&local_2798);
                }
              }
              local_27e0 = vblendvps_avx(local_27e0,*(undefined1 (*) [32])(ray + 0x100),auVar83);
            }
          }
          goto LAB_00f4a900;
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }